

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardsDriver.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  reference pvVar5;
  size_type sVar6;
  int local_a0;
  int local_9c;
  int i_3;
  int i_2;
  int local_7c;
  undefined1 auStack_78 [4];
  int armiesReceived;
  vector<CardType,_std::allocator<CardType>_> cardsExchanged;
  int local_58;
  int i_1;
  int handSize;
  Hand hand;
  int i;
  int size;
  undefined1 local_30 [8];
  Deck deck;
  int cavalryCount;
  int artilleryCount;
  int infantryCount;
  
  cavalryCount = 0;
  deck.discardPointer._4_4_ = 0;
  deck.discardPointer._0_4_ = 0;
  Deck::Deck((Deck *)local_30,9);
  Deck::createDeck((Deck *)local_30);
  piVar2 = Deck::getNumberOfCards((Deck *)local_30);
  iVar1 = *piVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n--------------------\n Creation of a Deck \n--------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (hand.handPointer._4_4_ = 0; hand.handPointer._4_4_ < iVar1;
      hand.handPointer._4_4_ = hand.handPointer._4_4_ + 1) {
    pvVar4 = Deck::getDeck((Deck *)local_30);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at
                       (pvVar4,(long)hand.handPointer._4_4_);
    if (*pvVar5 == INFANTRY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cavalryCount = cavalryCount + 1;
    }
    pvVar4 = Deck::getDeck((Deck *)local_30);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at
                       (pvVar4,(long)hand.handPointer._4_4_);
    if (*pvVar5 == ARTILLERY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      deck.discardPointer._4_4_ = deck.discardPointer._4_4_ + 1;
    }
    pvVar4 = Deck::getDeck((Deck *)local_30);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at
                       (pvVar4,(long)hand.handPointer._4_4_);
    if (*pvVar5 == CAVALRY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      deck.discardPointer._0_4_ = (int)deck.discardPointer + 1;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n\n------------------\n Deck Composition \n------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of [INFANTRY] cards: [");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cavalryCount);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of [ARTILLERY] cards: [");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,deck.discardPointer._4_4_);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of [CAVALRY] cards: [");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)deck.discardPointer);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n\n---------------\n Hand of Cards \n---------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Hand::Hand((Hand *)&i_1);
  Deck::draw((Deck *)local_30,(Hand *)&i_1);
  Deck::draw((Deck *)local_30,(Hand *)&i_1);
  Deck::draw((Deck *)local_30,(Hand *)&i_1);
  pvVar4 = Hand::getHand((Hand *)&i_1);
  sVar6 = std::vector<CardType,_std::allocator<CardType>_>::size(pvVar4);
  for (local_58 = 0; local_58 < (int)sVar6; local_58 = local_58 + 1) {
    pvVar4 = Hand::getHand((Hand *)&i_1);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_58);
    if (*pvVar5 == INFANTRY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    pvVar4 = Hand::getHand((Hand *)&i_1);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_58);
    if (*pvVar5 == ARTILLERY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      deck.discardPointer._4_4_ = deck.discardPointer._4_4_ + 1;
    }
    pvVar4 = Hand::getHand((Hand *)&i_1);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_58);
    if (*pvVar5 == CAVALRY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      deck.discardPointer._0_4_ = (int)deck.discardPointer + 1;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n\n-------------------\n Exchange Function \n-------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _auStack_78 = (pointer)0x0;
  cardsExchanged.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cardsExchanged.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<CardType,_std::allocator<CardType>_>::vector
            ((vector<CardType,_std::allocator<CardType>_> *)auStack_78);
  pvVar4 = Hand::getHand((Hand *)&i_1);
  pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,0);
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            ((vector<CardType,_std::allocator<CardType>_> *)auStack_78,pvVar5);
  pvVar4 = Hand::getHand((Hand *)&i_1);
  pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,1);
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            ((vector<CardType,_std::allocator<CardType>_> *)auStack_78,pvVar5);
  pvVar4 = Hand::getHand((Hand *)&i_1);
  pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,2);
  std::vector<CardType,_std::allocator<CardType>_>::push_back
            ((vector<CardType,_std::allocator<CardType>_> *)auStack_78,pvVar5);
  std::vector<CardType,_std::allocator<CardType>_>::vector
            ((vector<CardType,_std::allocator<CardType>_> *)&i_3,
             (vector<CardType,_std::allocator<CardType>_> *)auStack_78);
  iVar1 = Hand::exchange((Hand *)&i_1,(Deck *)local_30,
                         (vector<CardType,_std::allocator<CardType>_> *)&i_3);
  std::vector<CardType,_std::allocator<CardType>_>::~vector
            ((vector<CardType,_std::allocator<CardType>_> *)&i_3);
  local_7c = iVar1;
  if (iVar1 == -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Invalid set of cards exchanged. They must either: All be of the same type or all be different."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"\nCards attempted to exchange:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      pvVar4 = Hand::getHand((Hand *)&i_1);
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_9c);
      if (*pvVar5 == INFANTRY) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      pvVar4 = Hand::getHand((Hand *)&i_1);
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_9c);
      if (*pvVar5 == ARTILLERY) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        deck.discardPointer._4_4_ = deck.discardPointer._4_4_ + 1;
      }
      pvVar4 = Hand::getHand((Hand *)&i_1);
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_9c);
      if (*pvVar5 == CAVALRY) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        deck.discardPointer._0_4_ = (int)deck.discardPointer + 1;
      }
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Number of armies received: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7c);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n\n-----------------------\n Current Hand of Cards \n-----------------------"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar4 = Hand::getHand((Hand *)&i_1);
  sVar6 = std::vector<CardType,_std::allocator<CardType>_>::size(pvVar4);
  for (local_a0 = 0; local_a0 < (int)sVar6; local_a0 = local_a0 + 1) {
    pvVar4 = Hand::getHand((Hand *)&i_1);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_a0);
    if (*pvVar5 == INFANTRY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [INFANTRY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    pvVar4 = Hand::getHand((Hand *)&i_1);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_a0);
    if (*pvVar5 == ARTILLERY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [ARTILLERY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      deck.discardPointer._4_4_ = deck.discardPointer._4_4_ + 1;
    }
    pvVar4 = Hand::getHand((Hand *)&i_1);
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,(long)local_a0);
    if (*pvVar5 == CAVALRY) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Card: [CAVALRY]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      deck.discardPointer._0_4_ = (int)deck.discardPointer + 1;
    }
  }
  std::vector<CardType,_std::allocator<CardType>_>::~vector
            ((vector<CardType,_std::allocator<CardType>_> *)auStack_78);
  Hand::~Hand((Hand *)&i_1);
  Deck::~Deck((Deck *)local_30);
  return 0;
}

Assistant:

int main() {

    int infantryCount = 0;
    int artilleryCount = 0;
    int cavalryCount = 0;

    Deck deck = Deck(9);
    deck.createDeck();

    int size = *deck.getNumberOfCards();

    std::cout << "\n--------------------\n Creation of a Deck \n--------------------" << std::endl;

    for (int i = 0; i < size; i++) {

        if (deck.getDeck()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (deck.getDeck()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (deck.getDeck()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }

    std::cout << "\n\n------------------\n Deck Composition \n------------------" << std::endl;

    std::cout << "Number of [INFANTRY] cards: [" << infantryCount << "]" << std::endl;
    std::cout << "Number of [ARTILLERY] cards: [" << artilleryCount << "]" << std::endl;
    std::cout << "Number of [CAVALRY] cards: [" << cavalryCount << "]" << std::endl;

    std::cout << "\n\n---------------\n Hand of Cards \n---------------" << std::endl;

    Hand hand = Hand();
    deck.draw(hand);
    deck.draw(hand);
    deck.draw(hand);

    int handSize = hand.getHand()->size();

    for (int i = 0; i < handSize; i++) {
        if (hand.getHand()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (hand.getHand()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (hand.getHand()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }

    std::cout << "\n\n-------------------\n Exchange Function \n-------------------" << std::endl;

    std::vector<CardType> cardsExchanged = std::vector<CardType>();
    cardsExchanged.push_back(hand.getHand()->at(0));
    cardsExchanged.push_back(hand.getHand()->at(1));
    cardsExchanged.push_back(hand.getHand()->at(2));

    int armiesReceived = Hand::exchange(&hand, &deck, cardsExchanged);

    if (armiesReceived == -1) {
        std::cout << ("Invalid set of cards exchanged. They must either: All be of the same type or all be different.")
                  << std::endl;
        std::cout << ("\nCards attempted to exchange:") << std::endl;

        for (int i = 0; i < 3; i++) {
            if (hand.getHand()->at(i) == 0) {
                std::cout << "Card: [INFANTRY]" << std::endl;
                infantryCount++;
            }
            if (hand.getHand()->at(i) == 1) {
                std::cout << "Card: [ARTILLERY]" << std::endl;
                artilleryCount++;
            }
            if (hand.getHand()->at(i) == 2) {
                std::cout << "Card: [CAVALRY]" << std::endl;
                cavalryCount++;
            }
        }

    } else {
        std::cout << "Number of armies received: " << armiesReceived << std::endl;
    }

    std::cout << "\n\n-----------------------\n Current Hand of Cards \n-----------------------" << std::endl;

    handSize = hand.getHand()->size();

    for (int i = 0; i < handSize; i++) {
        if (hand.getHand()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (hand.getHand()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (hand.getHand()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }
}